

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void __thiscall
DensityCalculator<double,double>::initialize_bdens<InputData<double,unsigned_long>>
          (DensityCalculator<double,double> *this,InputData<double,_unsigned_long> *input_data,
          ModelParams *model_params,vector<unsigned_long,_std::allocator<unsigned_long>_> *ix_arr,
          ColumnSampler<double> *col_sampler)

{
  DensityCalculator<double,double> DVar1;
  int iVar2;
  iterator __position;
  size_t sVar3;
  ulong col;
  size_t *ix_arr_00;
  pointer puVar4;
  pointer puVar5;
  int *piVar6;
  long lVar7;
  pointer pcVar8;
  long lVar9;
  ulong uVar10;
  size_t sVar11;
  size_t sVar12;
  long lVar13;
  size_t __n;
  double dVar14;
  bool unsplittable;
  ModelParams *local_70;
  vector<signed_char,_std::allocator<signed_char>_> categ_present;
  
  DVar1 = (DensityCalculator<double,double>)model_params->fast_bratio;
  this[0x90] = DVar1;
  local_70 = model_params;
  if (DVar1 == (DensityCalculator<double,double>)0x1) {
    std::vector<double,_std::allocator<double>_>::reserve
              ((vector<double,_std::allocator<double>_> *)this,model_params->max_depth + 3);
    categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    __position._M_current = *(double **)(this + 8);
    if (__position._M_current == *(double **)(this + 0x10)) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                ((vector<double,_std::allocator<double>_> *)this,__position,(double *)&categ_present
                );
    }
    else {
      *__position._M_current = 0.0;
      *(double **)(this + 8) = __position._M_current + 1;
    }
  }
  if (input_data->ncat_ == (int *)0x0 && input_data->range_low == (double *)0x0) {
    if (input_data->ncols_numeric != 0) {
      std::vector<double,_std::allocator<double>_>::reserve
                ((vector<double,_std::allocator<double>_> *)(this + 0x78),local_70->max_depth + 3);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)(this + 0x48),input_data->ncols_numeric)
      ;
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)(this + 0x60),input_data->ncols_numeric)
      ;
      if (this[0x90] == (DensityCalculator<double,double>)0x0) {
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)(this + 0x98),
                   input_data->ncols_numeric);
      }
    }
    if (input_data->ncols_categ != 0) {
      std::vector<int,_std::allocator<int>_>::reserve
                ((vector<int,_std::allocator<int>_> *)(this + 200),local_70->max_depth + 2);
    }
    unsplittable = false;
    categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (input_data->ncols_categ != 0) {
      std::vector<signed_char,_std::allocator<signed_char>_>::resize
                (&categ_present,(long)input_data->max_categ);
    }
    ColumnSampler<double>::prepare_full_pass(col_sampler);
    while (pcVar8 = categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                    _M_impl.super__Vector_impl_data._M_start, sVar3 = col_sampler->curr_col,
          col_sampler->curr_pos != 0 && col_sampler->curr_pos != sVar3) {
      col_sampler->last_given = sVar3;
      col_sampler->curr_col = sVar3 + 1;
      col = (col_sampler->col_indices).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[sVar3];
      sVar3 = input_data->ncols_numeric;
      if (col < input_data->ncols_numeric) {
        ix_arr_00 = (ix_arr->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        if (input_data->Xc_indptr == (unsigned_long *)0x0) {
          get_range<double>(ix_arr_00,input_data->numeric_data + input_data->nrows * col,0,
                            ((long)(ix_arr->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ix_arr_00 >>
                            3) - 1,local_70->missing_action,
                            (double *)(*(long *)(this + 0x48) + col * 8),
                            (double *)(col * 8 + *(long *)(this + 0x60)),&unsplittable);
        }
        else {
          get_range<double,unsigned_long>
                    (ix_arr_00,0,
                     ((long)(ix_arr->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)ix_arr_00 >> 3) - 1,
                     col,input_data->Xc,input_data->Xc_ind,input_data->Xc_indptr,
                     local_70->missing_action,(double *)(*(long *)(this + 0x48) + col * 8),
                     (double *)(col * 8 + *(long *)(this + 0x60)),&unsplittable);
        }
        if (unsplittable == true) {
          *(undefined8 *)(*(long *)(this + 0x48) + col * 8) = 0;
          *(undefined8 *)(*(long *)(this + 0x60) + col * 8) = 0;
          if (this[0x90] == (DensityCalculator<double,double>)0x0) {
            *(undefined8 *)(*(long *)(this + 0x98) + col * 8) = 0;
          }
          ColumnSampler<double>::drop_col(col_sampler,col,0xffffffffffffffff);
        }
        if (this[0x90] == (DensityCalculator<double,double>)0x0) {
          dVar14 = *(double *)(*(long *)(this + 0x60) + col * 8) -
                   *(double *)(*(long *)(this + 0x48) + col * 8);
          if (dVar14 <= 0.0) {
            dVar14 = 0.0;
          }
          *(double *)(*(long *)(this + 0x98) + col * 8) = dVar14;
        }
      }
      else {
        puVar4 = (ix_arr->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        sVar12 = input_data->nrows;
        puVar5 = (ix_arr->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_finish;
        piVar6 = input_data->categ_data;
        iVar2 = input_data->ncat[col];
        __n = (size_t)iVar2;
        if (__n != 0) {
          memset(categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                 .super__Vector_impl_data._M_start,0xff,__n);
        }
        lVar13 = (long)puVar5 - (long)puVar4 >> 3;
        lVar9 = 0;
        do {
          if (-1 < (long)piVar6[(col - sVar3) * sVar12 + puVar4[lVar9]]) {
            pcVar8[piVar6[(col - sVar3) * sVar12 + puVar4[lVar9]]] = '\x01';
          }
          lVar9 = lVar9 + 1;
        } while (lVar13 + (ulong)(lVar13 == 0) != lVar9);
        if (iVar2 == 0) {
          uVar10 = 0;
        }
        else {
          sVar11 = 0;
          uVar10 = 0;
          do {
            uVar10 = uVar10 + ('\0' < pcVar8[sVar11]);
            sVar11 = sVar11 + 1;
          } while (__n != sVar11);
        }
        unsplittable = uVar10 < 2;
        if (unsplittable) {
          *(undefined4 *)(*(long *)(this + 0xb0) + (col - input_data->ncols_numeric) * 4) = 1;
          ColumnSampler<double>::drop_col(col_sampler,col,0xffffffffffffffff);
        }
        else {
          *(int *)(*(long *)(this + 0xb0) + (col - input_data->ncols_numeric) * 4) = (int)uVar10;
        }
      }
    }
    if (this[0x90] == (DensityCalculator<double,double>)0x0) {
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)(this + 0xe0),
                 (vector<int,_std::allocator<int>_> *)(this + 0xb0));
    }
    if (categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)categ_present.
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)categ_present.
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    if (input_data->ncols_numeric != 0) {
      std::vector<double,_std::allocator<double>_>::reserve
                ((vector<double,_std::allocator<double>_> *)(this + 0x78),local_70->max_depth + 3);
      std::vector<double,std::allocator<double>>::_M_assign_aux<double*>
                ((vector<double,std::allocator<double>> *)(this + 0x48),input_data->range_low,
                 input_data->range_low + input_data->ncols_numeric);
      std::vector<double,std::allocator<double>>::_M_assign_aux<double*>
                ((vector<double,std::allocator<double>> *)(this + 0x60),input_data->range_high,
                 input_data->range_high + input_data->ncols_numeric);
    }
    if (input_data->ncols_categ != 0) {
      std::vector<int,_std::allocator<int>_>::reserve
                ((vector<int,_std::allocator<int>_> *)(this + 200),local_70->max_depth + 2);
      std::vector<int,std::allocator<int>>::_M_assign_aux<int*>
                ((vector<int,std::allocator<int>> *)(this + 0xb0),input_data->ncat_,
                 input_data->ncat_ + input_data->ncols_categ);
    }
    if (this[0x90] == (DensityCalculator<double,double>)0x0) {
      if (input_data->ncols_numeric != 0) {
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)(this + 0x98),
                   input_data->ncols_numeric);
        sVar3 = input_data->ncols_numeric;
        if (sVar3 != 0) {
          lVar9 = *(long *)(this + 0x48);
          lVar13 = *(long *)(this + 0x60);
          lVar7 = *(long *)(this + 0x98);
          sVar12 = 0;
          do {
            *(double *)(lVar7 + sVar12 * 8) =
                 *(double *)(lVar13 + sVar12 * 8) - *(double *)(lVar9 + sVar12 * 8);
            sVar12 = sVar12 + 1;
          } while (sVar3 != sVar12);
        }
      }
      if (input_data->ncols_categ != 0) {
        std::vector<int,_std::allocator<int>_>::operator=
                  ((vector<int,_std::allocator<int>_> *)(this + 0xe0),
                   (vector<int,_std::allocator<int>_> *)(this + 0xb0));
      }
    }
  }
  return;
}

Assistant:

void DensityCalculator<ldouble_safe, real_t>::initialize_bdens(const InputData &input_data,
                                         const ModelParams &model_params,
                                         std::vector<size_t> &ix_arr,
                                         ColumnSampler<ldouble_safe> &col_sampler)
{
    this->fast_bratio = model_params.fast_bratio;
    if (this->fast_bratio)
    {
        this->multipliers.reserve(model_params.max_depth + 3);
        this->multipliers.push_back(0);
    }

    if (input_data.range_low != NULL || input_data.ncat_ != NULL)
    {
        if (input_data.ncols_numeric)
        {
            this->queue_box.reserve(model_params.max_depth+3);
            this->box_low.assign(input_data.range_low, input_data.range_low + input_data.ncols_numeric);
            this->box_high.assign(input_data.range_high, input_data.range_high + input_data.ncols_numeric);
        }

        if (input_data.ncols_categ)
        {
            this->queue_ncat.reserve(model_params.max_depth+2);
            this->ncat.assign(input_data.ncat_, input_data.ncat_ + input_data.ncols_categ);
        }

        if (!this->fast_bratio)
        {
            if (input_data.ncols_numeric)
            {
                this->ranges.resize(input_data.ncols_numeric);
                for (size_t col = 0; col < input_data.ncols_numeric; col++)
                    this->ranges[col] = this->box_high[col] - this->box_low[col];
            }

            if (input_data.ncols_categ)
            {
                this->ncat_orig = this->ncat;
            }
        }

        return;
    }

    if (input_data.ncols_numeric)
    {
        this->queue_box.reserve(model_params.max_depth+3);
        this->box_low.resize(input_data.ncols_numeric);
        this->box_high.resize(input_data.ncols_numeric);
        if (!this->fast_bratio)
            this->ranges.resize(input_data.ncols_numeric);
    }
    if (input_data.ncols_categ)
    {
        this->queue_ncat.reserve(model_params.max_depth+2);
    }
    bool unsplittable = false;
    
    size_t npresent = 0;
    std::vector<signed char> categ_present;
    if (input_data.ncols_categ)
    {
        categ_present.resize(input_data.max_categ);
    }


    col_sampler.prepare_full_pass();
    size_t col;
    while (col_sampler.sample_col(col))
    {
        if (col < input_data.ncols_numeric)
        {
            if (input_data.Xc_indptr != NULL)
            {
                get_range((size_t*)ix_arr.data(), (size_t)0, ix_arr.size()-(size_t)1, col,
                          input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                          model_params.missing_action, this->box_low[col], this->box_high[col], unsplittable);
            }

            else
            {
                get_range((size_t*)ix_arr.data(), input_data.numeric_data + input_data.nrows * col, (size_t)0, ix_arr.size()-(size_t)1,
                          model_params.missing_action, this->box_low[col], this->box_high[col], unsplittable);
            }


            if (unsplittable)
            {
                this->box_low[col] = 0;
                this->box_high[col] = 0;
                if (!this->fast_bratio)
                    this->ranges[col] = 0;
                col_sampler.drop_col(col);
            }

            if (!this->fast_bratio)
            {
                this->ranges[col] = (ldouble_safe)this->box_high[col] - (ldouble_safe)this->box_low[col];
                this->ranges[col] = std::fmax(this->ranges[col], (ldouble_safe)0);
            }
        }

        else
        {
            get_categs((size_t*)ix_arr.data(),
                       input_data.categ_data + input_data.nrows * (col - input_data.ncols_numeric),
                       (size_t)0, ix_arr.size()-(size_t)1, input_data.ncat[col],
                       model_params.missing_action, categ_present.data(), npresent, unsplittable);

            if (unsplittable)
            {
                this->ncat[col - input_data.ncols_numeric] = 1;
                col_sampler.drop_col(col);
            }

            else
            {
                this->ncat[col - input_data.ncols_numeric] = npresent;
            }
        }
    }

    if (!this->fast_bratio)
        this->ncat_orig = this->ncat;
}